

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

char * kwssys::SystemTools::ReplaceChars(char *str,char *toreplace,char replacement)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  
  pcVar3 = str;
  if ((str != (char *)0x0) && (cVar4 = *str, cVar4 != '\0')) {
    do {
      cVar1 = *toreplace;
      pcVar2 = toreplace + 1;
      while (cVar1 != '\0') {
        if (cVar4 == cVar1) {
          *str = replacement;
          cVar4 = replacement;
        }
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      }
      cVar4 = str[1];
      str = str + 1;
    } while (cVar4 != '\0');
  }
  return pcVar3;
}

Assistant:

char* SystemTools::ReplaceChars(char* str, const char* toreplace,
                                char replacement)
{
  if (str) {
    char* ptr = str;
    while (*ptr) {
      const char* ptr2 = toreplace;
      while (*ptr2) {
        if (*ptr == *ptr2) {
          *ptr = replacement;
        }
        ++ptr2;
      }
      ++ptr;
    }
  }
  return str;
}